

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_stream.c
# Opt level: O3

void test_write_format_zip_stream(void)

{
  int *_v1;
  unsigned_short uVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  void *buff;
  archive *_a;
  archive_entry *entry;
  la_ssize_t v2;
  unsigned_long v2_00;
  void *pvVar6;
  ulong uVar7;
  int *p_;
  void *pvVar8;
  int *piVar9;
  char file_data [8];
  size_t used;
  undefined8 local_58;
  void *local_50;
  void *local_48;
  unsigned_long local_40;
  size_t local_38;
  
  local_58 = 0x3837363534333231;
  buff = malloc(1000000);
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'@',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar3 = archive_write_set_format_zip(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'A',0,"ARCHIVE_OK",(long)iVar3,"archive_write_set_format_zip(a)",_a);
  iVar3 = archive_write_set_options(_a,"zip:!zip64");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'C',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_set_options(a, \"zip:!zip64\")",_a);
  iVar3 = archive_write_open_memory(_a,buff,1000000,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'E',0,"ARCHIVE_OK",(long)iVar3,
                      "archive_write_open_memory(a, buff, buffsize, &used)",_a);
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'G',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"file");
  archive_entry_set_mode(entry,0x81a4);
  archive_entry_set_uid(entry,10);
  archive_entry_set_gid(entry,0x14);
  archive_entry_set_mtime(entry,0,0);
  iVar3 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'M',0,"0",(long)iVar3,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(entry);
  v2 = archive_write_data(_a,&local_58,8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'O',8,"8",v2,"archive_write_data(a, file_data, sizeof(file_data))",
                      (void *)0x0);
  iVar3 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar3,"archive_write_close(a)",_a);
  iVar3 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Q',0,"ARCHIVE_OK",(long)iVar3,"archive_write_free(a)",(void *)0x0);
  dumpfile("constructed.zip",buff,local_38);
  pvVar6 = (void *)((long)buff + (local_38 - 0x16));
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  local_48 = pvVar6;
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Y',pvVar6,"p","PK\x05\x06","\"PK\\005\\006\"",4,"4",(void *)0x0);
  failure("This must be disk 0");
  uVar1 = i2le((void *)((long)buff + (local_38 - 0x12)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'[',(ulong)uVar1,"i2le(p + 4)",0,"0",(void *)0x0);
  failure("Central dir must start on disk 0");
  uVar1 = i2le((void *)((long)buff + (local_38 - 0x10)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L']',(ulong)uVar1,"i2le(p + 6)",0,"0",(void *)0x0);
  failure("All central dir entries are on this disk");
  uVar1 = i2le((void *)((long)buff + (local_38 - 0xe)));
  uVar2 = i2le((void *)((long)buff + (local_38 - 0xc)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'_',(ulong)uVar1,"i2le(p + 8)",(ulong)uVar2,"i2le(p + 10)",(void *)0x0);
  pvVar6 = (void *)((long)buff + (local_38 - 10));
  uVar4 = i4le(pvVar6);
  pvVar8 = (void *)((long)buff + (local_38 - 6));
  uVar5 = i4le(pvVar8);
  local_50 = (void *)((long)buff + (ulong)uVar5 + (ulong)uVar4);
  failure("no zip comment");
  uVar1 = i2le((void *)((long)buff + (local_38 - 2)));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'b',(ulong)uVar1,"i2le(p + 20)",0,"0",(void *)0x0);
  uVar4 = i4le(pvVar8);
  uVar7 = (ulong)uVar4;
  _v1 = (int *)(uVar7 + (long)buff);
  uVar4 = i4le(pvVar6);
  failure("Central file record at offset %u should begin with PK\\001\\002 signature",(ulong)uVar4);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'k',_v1,"p","PK\x01\x02","\"PK\\001\\002\"",4,"4",(void *)0x0);
  uVar1 = i2le(_v1 + 1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'l',(ulong)uVar1,"i2le(p + 4)",0x314,"3 * 256 + zip_version",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 6));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'm',(ulong)uVar1,"i2le(p + 6)",0x14,"zip_version",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'n',(ulong)uVar1,"i2le(p + 8)",8,"8",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'o',(ulong)uVar1,"i2le(p + 10)",8,"zip_compression",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'p',(ulong)uVar1,"i2le(p + 12)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0xe));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'q',(ulong)uVar1,"i2le(p + 14)",0x21,"33",(void *)0x0);
  v2_00 = bitcrc32(0,&local_58,8);
  uVar4 = i4le((void *)((long)buff + uVar7 + 0x10));
  local_40 = v2_00;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L's',(ulong)uVar4,"i4le(p + 16)",v2_00,"crc",(void *)0x0);
  uVar4 = i4le((void *)((long)buff + uVar7 + 0x14));
  uVar5 = i4le((void *)((long)buff + uVar7 + 0x18));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'u',(ulong)uVar5,"i4le(p + 24)",8,"sizeof(file_data)",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x1c));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'v',(ulong)uVar1,"i2le(p + 28)",4,"strlen(file_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x20));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'x',(ulong)uVar1,"i2le(p + 32)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x22));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'y',(ulong)uVar1,"i2le(p + 34)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x24));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'z',(ulong)uVar1,"i2le(p + 36)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + uVar7 + 0x26));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'{',(ulong)(uVar5 >> 0x10 & 0x3ff),"i4le(p + 38) >> 16 & 01777",0x1a4,
                      "file_perm",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + uVar7 + 0x2a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'|',(ulong)uVar5,"i4le(p + 42)",0,"0",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'}',(void *)((long)buff + uVar7 + 0x2e),"p + 46","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x1e));
  pvVar8 = (void *)((long)_v1 + (ulong)uVar1 + 0x32);
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x32));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x81',(ulong)uVar1,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  pvVar6 = (void *)((long)buff + uVar7 + 0x34);
  uVar1 = i2le(pvVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x82',(ulong)uVar1,"i2le(p + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x83',(ulong)*(byte *)((long)buff + uVar7 + 0x36),"p[4]",1,"1",(void *)0x0)
  ;
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x84',(ulong)*(byte *)((long)buff + uVar7 + 0x37),"p[5]",4,"4",(void *)0x0)
  ;
  uVar5 = i4le((void *)((long)buff + uVar7 + 0x38));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x85',(ulong)uVar5,"i4le(p + 6)",10,"file_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x86',(ulong)*(byte *)((long)buff + uVar7 + 0x3c),"p[10]",4,"4",(void *)0x0
                     );
  uVar5 = i4le((void *)((long)buff + uVar7 + 0x3d));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x87',(ulong)uVar5,"i4le(p + 11)",0x14,"file_gid",(void *)0x0);
  uVar1 = i2le(pvVar6);
  uVar7 = (ulong)uVar1;
  uVar1 = i2le((void *)((long)_v1 + uVar7 + 0x36));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x8a',(ulong)uVar1,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  pvVar6 = (void *)((long)_v1 + uVar7 + 0x38);
  uVar1 = i2le(pvVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x8b',(ulong)uVar1,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x8c',(ulong)*(byte *)((long)_v1 + uVar7 + 0x3a),"p[4]",1,"1",(void *)0x0);
  uVar5 = i4le((void *)((long)_v1 + uVar7 + 0x3b));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'\x8d',(ulong)uVar5,"i4le(p + 5)",0,"0",(void *)0x0);
  uVar1 = i2le(pvVar6);
  for (pvVar6 = (void *)((long)_v1 + uVar1 + uVar7 + 0x3a); pvVar6 < pvVar8;
      pvVar6 = (void *)((long)pvVar6 + (ulong)uVar1 + 4)) {
    uVar1 = i2le(pvVar6);
    failure("Unexpected extension 0x%04X",(ulong)uVar1);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                     ,L'\x99',L'\0',"0",(void *)0x0);
    uVar1 = i2le((void *)((long)pvVar6 + 2));
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'\x9e',(uint)(pvVar6 == pvVar8),"p == extension_end",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'\xa0',(uint)(pvVar6 == local_50),"p == eocd",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'¡',(uint)(pvVar6 == local_48),"p == eocd_record",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¥',buff,"p","PK\x03\x04","\"PK\\003\\004\"",4,"4",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 4));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¦',(ulong)uVar1,"i2le(p + 4)",0x14,"zip_version",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 6));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'§',(ulong)uVar1,"i2le(p + 6)",8,"8",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 8));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¨',(ulong)uVar1,"i2le(p + 8)",8,"zip_compression",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 10));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'©',(ulong)uVar1,"i2le(p + 10)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 0xc));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'ª',(ulong)uVar1,"i2le(p + 12)",0x21,"33",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + 0xe));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'«',(ulong)uVar5,"i4le(p + 14)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + 0x12));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¬',(ulong)uVar5,"i4le(p + 18)",0,"0",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + 0x16));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'­',(ulong)uVar5,"i4le(p + 22)",0,"0",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 0x1a));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'®',(ulong)uVar1,"i2le(p + 26)",4,"strlen(file_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 0x1c));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¯',(ulong)uVar1,"i2le(p + 28)",0x18,"24",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'°',(void *)((long)buff + 0x1e),"p + 30","file","file_name",4,
                      "strlen(file_name)",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 0x1c));
  piVar9 = (int *)((long)buff + (ulong)uVar1 + 0x22);
  uVar1 = i2le((void *)((long)buff + 0x22));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'´',(ulong)uVar1,"i2le(p)",0x7875,"0x7875",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 0x24));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'µ',(ulong)uVar1,"i2le(p + 2)",0xb,"11",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¶',(ulong)*(byte *)((long)buff + 0x26),"p[4]",1,"1",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'·',(ulong)*(byte *)((long)buff + 0x27),"p[5]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + 0x28));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¸',(ulong)uVar5,"i4le(p + 6)",10,"file_uid",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¹',(ulong)*(byte *)((long)buff + 0x2c),"p[10]",4,"4",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + 0x2d));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'º',(ulong)uVar5,"i4le(p + 11)",0x14,"file_gid",(void *)0x0);
  uVar1 = i2le((void *)((long)buff + 0x24));
  uVar7 = (ulong)uVar1;
  uVar1 = i2le((void *)((long)buff + uVar7 + 0x26));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'½',(ulong)uVar1,"i2le(p)",0x5455,"0x5455",(void *)0x0);
  pvVar6 = (void *)((long)buff + uVar7 + 0x28);
  uVar1 = i2le(pvVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¾',(ulong)uVar1,"i2le(p + 2)",5,"5",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'¿',(ulong)*(byte *)((long)buff + uVar7 + 0x2a),"p[4]",1,"1",(void *)0x0);
  uVar5 = i4le((void *)((long)buff + uVar7 + 0x2b));
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'À',(ulong)uVar5,"i4le(p + 5)",0,"0",(void *)0x0);
  uVar1 = i2le(pvVar6);
  for (p_ = (int *)((long)buff + uVar1 + uVar7 + 0x2a); p_ < piVar9;
      p_ = (int *)((long)p_ + (ulong)uVar1 + 4)) {
    uVar1 = i2le(p_);
    failure("Unexpected extension 0x%04X",(ulong)uVar1);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                     ,L'Æ',L'\0',"0",(void *)0x0);
    uVar1 = i2le((void *)((long)p_ + 2));
  }
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'Ë',(uint)(p_ == piVar9),"p == extension_end",(void *)0x0);
  for (piVar9 = p_; (piVar9 < _v1 && (*piVar9 != 0x8074b50)); piVar9 = (int *)((long)piVar9 + 1)) {
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Ò',(long)piVar9 - (long)p_,"data_end - data_start",(ulong)uVar4,
                      "compressed_size",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Ó',piVar9,"p","PK\a\b","\"PK\\007\\010\"",4,"4",(void *)0x0);
  uVar5 = i4le(piVar9 + 1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Ô',(ulong)uVar5,"i4le(p + 4)",local_40,"crc",(void *)0x0);
  uVar5 = i4le(piVar9 + 2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Õ',(ulong)uVar5,"i4le(p + 8)",(ulong)uVar4,"compressed_size",(void *)0x0);
  uVar4 = i4le(piVar9 + 3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                      ,L'Ö',(ulong)uVar4,"i4le(p + 12)",8,"sizeof(file_data)",(void *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_format_zip_stream.c"
                   ,L'Ù',(uint)(piVar9 + 4 == _v1),"p + 16 == central_header",(void *)0x0);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_stream)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t used, buffsize = 1000000;
	unsigned long crc;
	unsigned long compressed_size = 0;
	__LA_MODE_T file_perm = 00644;
#ifdef HAVE_ZLIB_H
	int zip_version = 20;
#else
	int zip_version = 10;
#endif
	int zip_compression = 8;
	short file_uid = 10, file_gid = 20;
	unsigned char *buff, *buffend, *p;
	unsigned char *central_header, *local_header, *eocd, *eocd_record;
	unsigned char *extension_start, *extension_end;
	unsigned char *data_start, *data_end;
	char file_data[] = {'1', '2', '3', '4', '5', '6', '7', '8'};
	const char *file_name = "file";

#ifndef HAVE_ZLIB_H
	zip_version = 10;
	zip_compression = 0;
#endif

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:!zip64"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, file_name);
	archive_entry_set_mode(ae, AE_IFREG | file_perm);
	archive_entry_set_uid(ae, file_uid);
	archive_entry_set_gid(ae, file_gid);
	archive_entry_set_mtime(ae, 0, 0);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, file_data, sizeof(file_data)));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));
	buffend = buff + used;
	dumpfile("constructed.zip", buff, used);

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	eocd_record = p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2le(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2le(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2le(p + 8), i2le(p + 10));
	eocd = buff + i4le(p + 12) + i4le(p + 16);
	failure("no zip comment");
	assertEqualInt(i2le(p + 20), 0);

	/* Get address of first entry in central directory. */
	central_header = p = buff + i4le(buffend - 6);
	failure("Central file record at offset %u should begin with"
	    " PK\\001\\002 signature",
	    i4le(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2le(p + 4), 3 * 256 + zip_version); /* Version made by */
	assertEqualInt(i2le(p + 6), zip_version); /* Version needed to extract */
	assertEqualInt(i2le(p + 8), 8); /* Flags */
	assertEqualInt(i2le(p + 10), zip_compression); /* Compression method */
	assertEqualInt(i2le(p + 12), 0); /* File time */
	assertEqualInt(i2le(p + 14), 33); /* File date */
	crc = bitcrc32(0, file_data, sizeof(file_data));
	assertEqualInt(i4le(p + 16), crc); /* CRC-32 */
	compressed_size = i4le(p + 20);  /* Compressed size */
	assertEqualInt(i4le(p + 24), sizeof(file_data)); /* Uncompressed size */
	assertEqualInt(i2le(p + 28), strlen(file_name)); /* Pathname length */
	/* assertEqualInt(i2le(p + 30), 28); */ /* Extra field length: See below */
	assertEqualInt(i2le(p + 32), 0); /* File comment length */
	assertEqualInt(i2le(p + 34), 0); /* Disk number start */
	assertEqualInt(i2le(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4le(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4le(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = central_header + 46 + strlen(file_name);
	extension_end = extension_start + i2le(central_header + 30);

	assertEqualInt(i2le(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), 0); /* 'UT' mtime */
	p += 4 + i2le(p + 2);

	/* Note: We don't expect to see zip64 extension in the central
	 * directory, since the writer knows the actual full size by
	 * the time it is ready to write the central directory and has
	 * no reason to insert it then.  Info-Zip seems to do the same
	 * thing. */

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2le(p));
		assert(0);
		p += 4 + i2le(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);

	assert(p == eocd);
	assert(p == eocd_record);

	/* Verify local header of file entry. */
	p = local_header = buff;
	assertEqualMem(p, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2le(p + 4), zip_version); /* Version needed to extract */
	assertEqualInt(i2le(p + 6), 8); /* Flags */
	assertEqualInt(i2le(p + 8), zip_compression); /* Compression method */
	assertEqualInt(i2le(p + 10), 0); /* File time */
	assertEqualInt(i2le(p + 12), 33); /* File date */
	assertEqualInt(i4le(p + 14), 0); /* CRC-32 */
	assertEqualInt(i4le(p + 18), 0); /* Compressed size */
	assertEqualInt(i4le(p + 22), 0); /* Uncompressed size */
	assertEqualInt(i2le(p + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2le(p + 28), 24); /* Extra field length */
	assertEqualMem(p + 30, file_name, strlen(file_name)); /* Pathname */
	p = extension_start = local_header + 30 + strlen(file_name);
	extension_end = extension_start + i2le(local_header + 28);

	assertEqualInt(i2le(p), 0x7875);  /* 'ux' extension header */
	assertEqualInt(i2le(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4le(p + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4le(p + 11), file_gid); /* 'Ux' GID */
	p += 4 + i2le(p + 2);

	assertEqualInt(i2le(p), 0x5455);  /* 'UT' extension header */
	assertEqualInt(i2le(p + 2), 5); /* 'UT' size */
	assertEqualInt(p[4], 1); /* 'UT' flags */
	assertEqualInt(i4le(p + 5), 0); /* 'UT' mtime */
	p += 4 + i2le(p + 2);

	/* Just in case: Report any extra extensions. */
	while (p < extension_end) {
		failure("Unexpected extension 0x%04X", i2le(p));
		assert(0);
		p += 4 + i2le(p + 2);
	}

	/* Should have run exactly to end of extra data. */
	assert(p == extension_end);
	data_start = p;

	/* Data descriptor should follow compressed data. */
	while (p < central_header && memcmp(p, "PK\007\010", 4) != 0)
		++p;
	data_end = p;
	assertEqualInt(data_end - data_start, compressed_size);
	assertEqualMem(p, "PK\007\010", 4);
	assertEqualInt(i4le(p + 4), crc); /* CRC-32 */
	assertEqualInt(i4le(p + 8), compressed_size); /* compressed size */
	assertEqualInt(i4le(p + 12), sizeof(file_data)); /* uncompressed size */

	/* Central directory should immediately follow the data descriptor. */
	assert(p + 16 == central_header);

	free(buff);
}